

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::RadixPartitionedTupleData::InitializeAppendStateInternal
          (RadixPartitionedTupleData *this,PartitionedTupleDataAppendState *state,
          TupleDataPinProperties properties)

{
  unsafe_vector<TupleDataPinState> *this_00;
  TupleDataLayout *pTVar1;
  pointer pTVar2;
  long lVar3;
  size_type sVar4;
  long lVar5;
  bool bVar6;
  ulong local_70;
  vector<unsigned_long,_true> column_ids;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  sVar4 = 1L << ((byte)this->radix_bits & 0x3f);
  this_00 = &state->partition_pin_states;
  std::vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>::reserve
            ((vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_> *)
             this_00,sVar4);
  lVar5 = 0;
  lVar3 = 0;
  while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
    std::vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>::
    emplace_back<>((vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_> *)
                   this_00);
    pTVar2 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
             ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                           *)((long)&(((this->super_PartitionedTupleData).partitions.
                                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       .
                                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                     )._M_t + lVar5));
    TupleDataCollection::InitializeAppend
              (pTVar2,(TupleDataPinState *)
                      ((long)&((this_00->
                               super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                               ).
                               super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                               ._M_impl.super__Vector_impl_data._M_start)->row_handles + lVar3),
               properties);
    lVar3 = lVar3 + 0x38;
    lVar5 = lVar5 + 8;
  }
  pTVar1 = (this->super_PartitionedTupleData).layout;
  sVar4 = ((long)(pTVar1->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(pTVar1->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,sVar4);
  for (local_70 = 0; local_70 < sVar4; local_70 = local_70 + 1) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&column_ids,&local_70);
  }
  pTVar2 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
           ::operator->((this->super_PartitionedTupleData).partitions.
                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  local_48._M_impl.super__Vector_impl_data._M_start =
       column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  TupleDataCollection::InitializeChunkState
            (pTVar2,&state->chunk_state,(vector<unsigned_long,_true> *)&local_48);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  fixed_size_map_t<duckdb::list_entry_t>::resize
            (&state->fixed_partition_entries,1L << ((byte)this->radix_bits & 0x3f));
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  return;
}

Assistant:

void RadixPartitionedTupleData::InitializeAppendStateInternal(PartitionedTupleDataAppendState &state,
                                                              const TupleDataPinProperties properties) const {
	// Init pin state per partition
	const auto num_partitions = RadixPartitioning::NumberOfPartitions(radix_bits);
	state.partition_pin_states.reserve(num_partitions);
	for (idx_t i = 0; i < num_partitions; i++) {
		state.partition_pin_states.emplace_back();
		partitions[i]->InitializeAppend(state.partition_pin_states[i], properties);
	}

	// Init single chunk state
	auto column_count = layout.ColumnCount();
	vector<column_t> column_ids;
	column_ids.reserve(column_count);
	for (idx_t col_idx = 0; col_idx < column_count; col_idx++) {
		column_ids.emplace_back(col_idx);
	}
	partitions[0]->InitializeChunkState(state.chunk_state, std::move(column_ids));

	// Initialize fixed-size map
	state.fixed_partition_entries.resize(RadixPartitioning::NumberOfPartitions(radix_bits));
}